

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int mbedtls_pk_load_file(char *path,uchar **buf,size_t *n)

{
  size_t sVar1;
  FILE *__stream;
  size_t sVar2;
  uchar *puVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  int iVar7;
  
  __stream = fopen(path,"rb");
  iVar7 = -0x3e00;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    if (sVar2 == 0xffffffffffffffff) {
      fclose(__stream);
    }
    else {
      fseek(__stream,0,0);
      *n = sVar2;
      puVar3 = (uchar *)calloc(1,sVar2 + 1);
      *buf = puVar3;
      if (puVar3 == (uchar *)0x0) {
        fclose(__stream);
        iVar7 = -0x3f80;
      }
      else {
        sVar4 = fread(puVar3,1,sVar2,__stream);
        sVar2 = *n;
        fclose(__stream);
        puVar3 = *buf;
        sVar1 = *n;
        if (sVar4 == sVar2) {
          puVar3[sVar1] = '\0';
          pcVar5 = strstr((char *)*buf,"-----BEGIN ");
          iVar7 = 0;
          if (pcVar5 != (char *)0x0) {
            *n = *n + 1;
            iVar7 = 0;
          }
        }
        else {
          if (sVar1 != 0) {
            sVar6 = 0;
            do {
              puVar3[sVar6] = '\0';
              sVar6 = sVar6 + 1;
            } while (sVar1 != sVar6);
            puVar3 = *buf;
          }
          free(puVar3);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int mbedtls_pk_load_file( const char *path, unsigned char **buf, size_t *n )
{
    FILE *f;
    long size;

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    if( ( size = ftell( f ) ) == -1 )
    {
        fclose( f );
        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );
    }
    fseek( f, 0, SEEK_SET );

    *n = (size_t) size;

    if( *n + 1 == 0 ||
        ( *buf = mbedtls_calloc( 1, *n + 1 ) ) == NULL )
    {
        fclose( f );
        return( MBEDTLS_ERR_PK_ALLOC_FAILED );
    }

    if( fread( *buf, 1, *n, f ) != *n )
    {
        fclose( f );

        mbedtls_zeroize( *buf, *n );
        mbedtls_free( *buf );

        return( MBEDTLS_ERR_PK_FILE_IO_ERROR );
    }

    fclose( f );

    (*buf)[*n] = '\0';

    if( strstr( (const char *) *buf, "-----BEGIN " ) != NULL )
        ++*n;

    return( 0 );
}